

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint *in_RSI;
  long in_RDI;
  int n;
  u8 opcode;
  int *aLabel;
  Parse *pParse;
  Op *pOp;
  int nMaxArgs;
  int i;
  void *in_stack_ffffffffffffffb8;
  sqlite3 *in_stack_ffffffffffffffc0;
  byte *local_20;
  uint local_18;
  int local_14;
  
  local_18 = *in_RSI;
  lVar2 = *(long *)(in_RDI + 0x30);
  lVar3 = *(long *)(lVar2 + 0x80);
  *(ushort *)(in_RDI + 0x8c) = *(ushort *)(in_RDI + 0x8c) & 0xffbf | 0x40;
  *(ushort *)(in_RDI + 0x8c) = *(ushort *)(in_RDI + 0x8c) & 0xff7f;
  local_20 = *(byte **)(in_RDI + 8);
  local_14 = *(int *)(in_RDI + 0x3c);
  do {
    local_14 = local_14 + -1;
    if (local_14 < 0) {
      sqlite3DbFree(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *(undefined8 *)(lVar2 + 0x80) = 0;
      *(undefined4 *)(lVar2 + 0x78) = 0;
      *in_RSI = local_18;
      return;
    }
    bVar1 = *local_20;
    in_stack_ffffffffffffffc0 = (sqlite3 *)(ulong)(bVar1 - 1);
    switch(in_stack_ffffffffffffffc0) {
    case (sqlite3 *)0x0:
    case (sqlite3 *)0x9:
      if ((int)local_18 < (int)(uint)local_20[3]) {
        local_18 = (uint)local_20[3];
      }
      break;
    case (sqlite3 *)0x3:
      if (*(int *)(local_20 + 8) != 0) {
        *(ushort *)(in_RDI + 0x8c) = *(ushort *)(in_RDI + 0x8c) & 0xffbf;
      }
    case (sqlite3 *)0x1:
    case (sqlite3 *)0x2:
      *(ushort *)(in_RDI + 0x8c) = *(ushort *)(in_RDI + 0x8c) & 0xff7f | 0x80;
      break;
    case (sqlite3 *)0x4:
    case (sqlite3 *)0x6:
    case (sqlite3 *)0x8:
      *(code **)(local_20 + 0x10) = sqlite3BtreeNext;
      local_20[1] = 0xed;
      break;
    case (sqlite3 *)0x5:
    case (sqlite3 *)0x7:
      *(code **)(local_20 + 0x10) = sqlite3BtreePrevious;
      local_20[1] = 0xed;
      break;
    case (sqlite3 *)0xa:
    case (sqlite3 *)0xb:
    case (sqlite3 *)0xc:
      *(ushort *)(in_RDI + 0x8c) = *(ushort *)(in_RDI + 0x8c) & 0xffbf;
      *(ushort *)(in_RDI + 0x8c) = *(ushort *)(in_RDI + 0x8c) & 0xff7f | 0x80;
      break;
    case (sqlite3 *)0xd:
      if ((int)local_18 < (int)*(uint *)(local_20 + -0x14)) {
        local_18 = *(uint *)(local_20 + -0x14);
      }
      break;
    case (sqlite3 *)0xe:
      if ((int)local_18 < *(int *)(local_20 + 8)) {
        local_18 = *(uint *)(local_20 + 8);
      }
    }
    local_20[2] = ""[bVar1];
    if (((local_20[2] & 1) != 0) && (*(int *)(local_20 + 8) < 0)) {
      *(undefined4 *)(local_20 + 8) =
           *(undefined4 *)(lVar3 + (long)(-1 - *(int *)(local_20 + 8)) * 4);
    }
    local_20 = local_20 + 0x18;
  } while( true );
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int i;
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  for(pOp=p->aOp, i=p->nOp-1; i>=0; i--, pOp++){
    u8 opcode = pOp->opcode;

    /* NOTE: Be sure to update mkopcodeh.awk when adding or removing
    ** cases from this switch! */
    switch( opcode ){
      case OP_Function:
      case OP_AggStep: {
        if( pOp->p5>nMaxArgs ) nMaxArgs = pOp->p5;
        break;
      }
      case OP_Transaction: {
        if( pOp->p2!=0 ) p->readOnly = 0;
        /* fall thru */
      }
      case OP_AutoCommit:
      case OP_Savepoint: {
        p->bIsReader = 1;
        break;
      }
#ifndef SQLITE_OMIT_WAL
      case OP_Checkpoint:
#endif
      case OP_Vacuum:
      case OP_JournalMode: {
        p->readOnly = 0;
        p->bIsReader = 1;
        break;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      case OP_VUpdate: {
        if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
        break;
      }
      case OP_VFilter: {
        int n;
        assert( p->nOp - i >= 3 );
        assert( pOp[-1].opcode==OP_Integer );
        n = pOp[-1].p1;
        if( n>nMaxArgs ) nMaxArgs = n;
        break;
      }
#endif
      case OP_Next:
      case OP_NextIfOpen:
      case OP_SorterNext: {
        pOp->p4.xAdvance = sqlite3BtreeNext;
        pOp->p4type = P4_ADVANCE;
        break;
      }
      case OP_Prev:
      case OP_PrevIfOpen: {
        pOp->p4.xAdvance = sqlite3BtreePrevious;
        pOp->p4type = P4_ADVANCE;
        break;
      }
    }

    pOp->opflags = sqlite3OpcodeProperty[opcode];
    if( (pOp->opflags & OPFLG_JUMP)!=0 && pOp->p2<0 ){
      assert( -1-pOp->p2<pParse->nLabel );
      pOp->p2 = aLabel[-1-pOp->p2];
    }
  }
  sqlite3DbFree(p->db, pParse->aLabel);
  pParse->aLabel = 0;
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}